

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skeletal_mesh.h
# Opt level: O0

void __thiscall SkeletalMesh::Scene::Scene(Scene *this)

{
  Scene *this_local;
  
  this->_vptr_Scene = (_func_int **)&PTR__Scene_00379d90;
  std::__cxx11::string::string((string *)&this->name);
  std::__cxx11::string::string((string *)&this->filename);
  Assimp::Importer::Importer(&this->importer);
  std::vector<SkeletalMesh::MeshEntry,_std::allocator<SkeletalMesh::MeshEntry>_>::vector
            (&this->meshEntry);
  std::vector<SkeletalMesh::Material,_std::allocator<SkeletalMesh::Material>_>::vector
            (&this->material);
  std::vector<SkeletalMesh::Bone,_std::allocator<SkeletalMesh::Bone>_>::vector(&this->skeleton);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::map(&this->nameBoneMap);
  this->available = false;
  this->vao = 0;
  this->vbo = 0;
  this->ebo = 0;
  return;
}

Assistant:

Scene() {
            available = false;
            vao = 0;
            vbo = 0;
            ebo = 0;
        }